

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_enforce_retry(int use_cookie)

{
  uint8_t *__ptr;
  int iVar1;
  ptls_t *tls;
  ptls_t *tls_00;
  size_t consumed;
  size_t local_120;
  ptls_buffer_t local_118;
  ptls_buffer_t local_f8;
  ptls_buffer_t local_d8;
  undefined1 local_b8 [80];
  char *local_68;
  undefined8 uStack_60;
  byte local_58;
  undefined7 uStack_57;
  ptls_raw_extension_t *ppStack_50;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *local_48;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *p_Stack_40;
  
  local_48 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  p_Stack_40 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
               0x0;
  ppStack_50 = (ptls_raw_extension_t *)0x0;
  local_b8._64_8_ = 0;
  local_b8._48_8_ = (uint8_t *)0x0;
  local_b8._56_8_ = 0;
  local_b8._32_8_ = (size_t *)0x0;
  local_b8._40_8_ = 0;
  local_b8._16_8_ = (uint8_t *)0x0;
  local_b8._24_8_ = 0;
  local_b8._0_8_ = (ptls_iovec_t *)0x0;
  local_b8._8_8_ = 0;
  local_b8._72_8_ = "0123456789abcdef0123456789abcdef0123456789abcdef";
  local_68 = "1.2.3.4:1234";
  uStack_60 = 0xc;
  uStack_57 = 0;
  local_58 = ((char)use_cookie * '\x02' & 2U) + 1;
  local_118.base = "";
  local_118.capacity = 0;
  local_118.off = 0;
  local_118._24_8_ = local_118._24_8_ & 0xffffffff00000000;
  local_f8.base = "";
  local_f8.capacity = 0;
  local_f8.off = 0;
  local_f8._24_8_ = local_f8._24_8_ & 0xffffffff00000000;
  local_d8.base = "";
  local_d8.capacity = 0;
  local_d8.off = 0;
  local_d8.is_allocated = 0;
  tls = ptls_new(ctx,0);
  iVar1 = ptls_handshake(tls,&local_118,(void *)0x0,(size_t *)0x0,(ptls_handshake_properties_t *)0x0
                        );
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x3fc);
  _ok((uint)(local_118.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x3fd);
  tls_00 = ptls_new(ctx,1);
  local_120 = local_118.off;
  do {
    iVar1 = ptls_handshake(tls_00,&local_f8,local_118.base,&local_120,
                           (ptls_handshake_properties_t *)local_b8);
  } while ((tls_00->field_0x160 & 0x20) != 0);
  local_118.off = 0;
  if (use_cookie == 0) {
    _ok((uint)(iVar1 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x40c);
  }
  else {
    _ok((uint)(iVar1 == 0x206),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x408);
    ptls_free(tls_00);
    tls_00 = ptls_new(ctx,1);
  }
  local_120 = local_f8.off;
  iVar1 = ptls_handshake(tls,&local_118,local_f8.base,&local_120,(ptls_handshake_properties_t *)0x0)
  ;
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x411);
  _ok((uint)(local_f8.off == local_120),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x412);
  local_f8.off = 0;
  local_120 = local_118.off;
  do {
    iVar1 = ptls_handshake(tls_00,&local_f8,local_118.base,&local_120,
                           (ptls_handshake_properties_t *)local_b8);
  } while ((tls_00->field_0x160 & 0x20) != 0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x419);
  _ok((uint)(local_118.off == local_120),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x41a);
  local_118.off = 0;
  local_120 = local_f8.off;
  iVar1 = ptls_handshake(tls,&local_118,local_f8.base,&local_120,(ptls_handshake_properties_t *)0x0)
  ;
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x41f);
  _ok((uint)(local_f8.off == local_120),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x420);
  local_f8.off = 0;
  iVar1 = ptls_send(tls,&local_118,"hello world",0xb);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x424);
  local_120 = local_118.off;
  do {
    iVar1 = ptls_receive(tls_00,&local_d8,local_118.base,&local_120);
  } while ((tls_00->field_0x160 & 0x20) != 0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x42a);
  _ok((uint)(local_118.off == local_120),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x42b);
  local_118.off = 0;
  _ok((uint)(local_d8.off == 0xb),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x42e);
  __ptr = local_d8.base;
  _ok((uint)(*(long *)((long)local_d8.base + 3) == 0x646c726f77206f6c &&
            *(long *)local_d8.base == 0x6f77206f6c6c6568),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x42f);
  ptls_free(tls);
  ptls_free(tls_00);
  (*ptls_clear_memory)(local_118.base,local_118.off);
  if (local_118.is_allocated != 0) {
    free(local_118.base);
  }
  local_118.off = 0;
  local_118.is_allocated = 0;
  local_118._28_4_ = 0;
  local_118.base = (uint8_t *)0x0;
  local_118.capacity = 0;
  (*ptls_clear_memory)(local_f8.base,local_f8.off);
  if (local_f8.is_allocated != 0) {
    free(local_f8.base);
  }
  local_f8.off = 0;
  local_f8.is_allocated = 0;
  local_f8._28_4_ = 0;
  local_f8.base = (uint8_t *)0x0;
  local_f8.capacity = 0;
  (*ptls_clear_memory)(__ptr,0);
  if (local_d8.is_allocated != 0) {
    free(__ptr);
  }
  return;
}

Assistant:

static void test_enforce_retry(int use_cookie)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t server_hs_prop = {{{{NULL}}}};
    ptls_buffer_t cbuf, sbuf, decbuf;
    size_t consumed;
    int ret;

    server_hs_prop.server.cookie.key = "0123456789abcdef0123456789abcdef0123456789abcdef";
    server_hs_prop.server.cookie.additional_data = ptls_iovec_init("1.2.3.4:1234", 12);
    server_hs_prop.server.enforce_retry = 1;
    server_hs_prop.server.retry_uses_cookie = use_cookie;

    ptls_buffer_init(&cbuf, "", 0);
    ptls_buffer_init(&sbuf, "", 0);
    ptls_buffer_init(&decbuf, "", 0);

    client = ptls_new(ctx, 0);

    ret = ptls_handshake(client, &cbuf, NULL, NULL, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off != 0);

    server = ptls_new(ctx, 1);

    consumed = cbuf.off;
    do
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
    while (ptls_handshake_in_private_key(server));
    cbuf.off = 0;

    if (use_cookie) {
        ok(ret == PTLS_ERROR_STATELESS_RETRY);
        ptls_free(server);
        server = ptls_new(ctx, 1);
    } else {
        ok(ret == PTLS_ERROR_IN_PROGRESS);
    }

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(sbuf.off == consumed);
    sbuf.off = 0;

    consumed = cbuf.off;
    do
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
    while (ptls_handshake_in_private_key(server));
    ok(ret == 0);
    ok(cbuf.off == consumed);
    cbuf.off = 0;

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(sbuf.off == consumed);
    sbuf.off = 0;

    ret = ptls_send(client, &cbuf, "hello world", 11);
    ok(ret == 0);

    consumed = cbuf.off;
    do
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
    while (ptls_handshake_in_private_key(server));
    ok(ret == 0);
    ok(cbuf.off == consumed);
    cbuf.off = 0;

    ok(decbuf.off == 11);
    ok(memcmp(decbuf.base, "hello world", 11) == 0);
    decbuf.off = 0;

    ptls_free(client);
    ptls_free(server);

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
}